

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O2

bool __thiscall QOpenGL2PaintEngineEx::begin(QOpenGL2PaintEngineEx *this,QPaintDevice *pdev)

{
  QOpenGLVertexArrayObject *this_00;
  QOpenGLBuffer *pQVar1;
  long lVar2;
  undefined8 uVar3;
  pair<int,_int> pVar4;
  bool bVar5;
  byte bVar6;
  char cVar7;
  int iVar8;
  QOpenGLContext *pQVar9;
  QOpenGLContext *pQVar10;
  long lVar11;
  QObject *ptr;
  QSize QVar12;
  QOpenGLEngineShaderManager *this_01;
  socklen_t __len;
  long lVar13;
  sockaddr *__addr;
  pair<int,_int> *__y;
  long in_FS_OFFSET;
  pair<int,_int> local_70;
  QSurfaceFormat local_68 [8];
  pair<int,_int> local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&this->field_0x18;
  *(QPaintDevice **)(lVar2 + 0x238) = pdev;
  if (pdev == (QPaintDevice *)0x0) {
    bVar5 = false;
    goto LAB_001440f9;
  }
  (**(code **)(*(long *)pdev + 0x40))(pdev);
  pQVar9 = QOpenGLPaintDevice::context(*(QOpenGLPaintDevice **)(lVar2 + 0x238));
  pQVar10 = (QOpenGLContext *)QOpenGLContext::currentContext();
  if (pQVar9 == pQVar10) {
    pQVar9 = QOpenGLPaintDevice::context(*(QOpenGLPaintDevice **)(lVar2 + 0x238));
    if (pQVar9 != (QOpenGLContext *)0x0) {
      lVar11 = QOpenGLContext::currentContext();
      if ((*(long *)(lVar2 + 0x248) == 0) || (*(int *)(*(long *)(lVar2 + 0x248) + 4) == 0)) {
        lVar13 = 0;
      }
      else {
        lVar13 = *(long *)(lVar2 + 0x250);
      }
      if (lVar13 == lVar11) {
        bVar5 = QPointer::operator_cast_to_bool((QPointer *)(lVar2 + 0x248));
        __len = (socklen_t)lVar13;
        if (bVar5) {
          lVar11 = QOpenGLContext::currentContext();
          __len = (socklen_t)lVar13;
          if (lVar11 != 0) {
            QOpenGLContext::format();
            QOpenGLContext::currentContext();
            QOpenGLContext::format();
            bVar5 = operator!=((QSurfaceFormat *)&local_58,(QSurfaceFormat *)&local_60);
            QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_60);
            QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_58);
            __len = (socklen_t)lVar13;
            if (bVar5) goto LAB_00143cbc;
          }
        }
      }
      else {
LAB_00143cbc:
        __len = (socklen_t)lVar13;
        QOpenGLBuffer::destroy((QOpenGLBuffer *)(lVar2 + 0x408));
        QOpenGLBuffer::destroy((QOpenGLBuffer *)(lVar2 + 0x410));
        QOpenGLBuffer::destroy((QOpenGLBuffer *)(lVar2 + 0x418));
        QOpenGLBuffer::destroy((QOpenGLBuffer *)(lVar2 + 0x420));
        QOpenGLVertexArrayObject::destroy((QOpenGLVertexArrayObject *)(lVar2 + 0x3f8));
      }
      ptr = (QObject *)QOpenGLContext::currentContext();
      QWeakPointer<QObject>::assign<QObject>((QWeakPointer<QObject> *)(lVar2 + 0x248),ptr);
      *(QOpenGL2PaintEngineEx **)(*(long *)(*(long *)(lVar2 + 0x250) + 8) + 0x100) = this;
      (**(code **)(**(long **)(*(long *)(lVar2 + 0x238) + 0x10) + 0x10))();
      QOpenGLFunctions::initializeOpenGLFunctions();
      QOpenGLContext::format();
      iVar8 = QSurfaceFormat::profile();
      if (iVar8 == 1) {
        QOpenGLContext::format();
        local_60 = (pair<int,_int>)QSurfaceFormat::version();
        __y = &local_70;
        local_70.first = 3;
        local_70.second = 2;
        bVar5 = std::operator>=(&local_60,__y);
        iVar8 = (int)__y;
        QSurfaceFormat::~QSurfaceFormat(local_68);
        QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_58);
        if (bVar5) {
          this_00 = (QOpenGLVertexArrayObject *)(lVar2 + 0x3f8);
          bVar5 = QOpenGLVertexArrayObject::isCreated(this_00);
          if (!bVar5) {
            bVar5 = QOpenGLVertexArrayObject::create(this_00);
            if (bVar5) {
              QOpenGLVertexArrayObject::bind(this_00,iVar8,__addr,__len);
            }
          }
        }
      }
      else {
        QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_58);
      }
      pQVar1 = (QOpenGLBuffer *)(lVar2 + 0x408);
      bVar5 = QOpenGLBuffer::isCreated(pQVar1);
      if (!bVar5) {
        QOpenGLBuffer::create(pQVar1);
        QOpenGLBuffer::setUsagePattern(pQVar1,StreamDraw);
      }
      pQVar1 = (QOpenGLBuffer *)(lVar2 + 0x410);
      bVar5 = QOpenGLBuffer::isCreated(pQVar1);
      if (!bVar5) {
        QOpenGLBuffer::create(pQVar1);
        QOpenGLBuffer::setUsagePattern(pQVar1,StreamDraw);
      }
      pQVar1 = (QOpenGLBuffer *)(lVar2 + 0x418);
      bVar5 = QOpenGLBuffer::isCreated(pQVar1);
      if (!bVar5) {
        QOpenGLBuffer::create(pQVar1);
        QOpenGLBuffer::setUsagePattern(pQVar1,StreamDraw);
      }
      pQVar1 = (QOpenGLBuffer *)(lVar2 + 0x420);
      bVar5 = QOpenGLBuffer::isCreated(pQVar1);
      if (!bVar5) {
        QOpenGLBuffer::create(pQVar1);
        QOpenGLBuffer::setUsagePattern(pQVar1,StreamDraw);
      }
      for (lVar11 = -3; lVar11 != 0; lVar11 = lVar11 + 1) {
        *(undefined1 *)(lVar2 + 0x263 + lVar11) = 0;
      }
      QVar12 = QOpenGLPaintDevice::size(*(QOpenGLPaintDevice **)(lVar2 + 0x238));
      *(int *)(lVar2 + 0x240) = QVar12.wd.m_i.m_i;
      *(int *)(lVar2 + 0x244) = QVar12.ht.m_i.m_i;
      *(undefined4 *)(lVar2 + 600) = 2;
      *(undefined1 *)(lVar2 + 0x428) = 1;
      *(undefined4 *)(lVar2 + 0x263) = 0x1010101;
      *(undefined2 *)(lVar2 + 0x267) = 0x101;
      QPaintEngine::systemClip();
      bVar6 = QRegion::isEmpty();
      *(byte *)(lVar2 + 0x26a) = bVar6 ^ 1;
      QRegion::~QRegion((QRegion *)&local_58);
      QBrush::QBrush((QBrush *)&local_58);
      uVar3 = *(undefined8 *)(lVar2 + 0x290);
      *(ulong *)(lVar2 + 0x290) = CONCAT44(uStack_54,local_58);
      local_58 = (undefined4)uVar3;
      uStack_54 = (undefined4)((ulong)uVar3 >> 0x20);
      QBrush::~QBrush((QBrush *)&local_58);
      local_58 = 0;
      uStack_54 = 0;
      uStack_50 = CONCAT44((int)((ulong)*(undefined8 *)(lVar2 + 0x240) >> 0x20) + -1,
                           (int)*(undefined8 *)(lVar2 + 0x240) + -1);
      pQVar9 = (QOpenGLContext *)0x0;
      QRegion::QRegion((QRegion *)&local_60,&local_58,0);
      pVar4 = *(pair<int,_int> *)(lVar2 + 0x270);
      *(pair<int,_int> *)(lVar2 + 0x270) = local_60;
      local_60 = pVar4;
      QRegion::~QRegion((QRegion *)&local_60);
      *(undefined1 *)(lVar2 + 0x269) = 1;
      this_01 = (QOpenGLEngineShaderManager *)operator_new(0x98);
      if (*(long *)(lVar2 + 0x248) != 0) {
        if (*(int *)(*(long *)(lVar2 + 0x248) + 4) == 0) {
          pQVar9 = (QOpenGLContext *)0x0;
        }
        else {
          pQVar9 = *(QOpenGLContext **)(lVar2 + 0x250);
        }
      }
      QOpenGLEngineShaderManager::QOpenGLEngineShaderManager(this_01,pQVar9);
      *(QOpenGLEngineShaderManager **)(lVar2 + 0x230) = this_01;
      (**(code **)(*(long *)(lVar2 + 0x220) + 0x70))(0xb90);
      (**(code **)(*(long *)(lVar2 + 0x220) + 0x70))(0xb71);
      (**(code **)(*(long *)(lVar2 + 0x220) + 0x70))(0xc11);
      *(undefined4 *)(lVar2 + 0x25c) = 2;
      QOpenGLContext::currentContext();
      cVar7 = QOpenGLContext::isOpenGLES();
      if (cVar7 == '\0') {
        (**(code **)(*(long *)(lVar2 + 0x220) + 0x70))(0x809d);
        *(undefined4 *)(lVar2 + 0x25c) = 3;
        *(undefined1 *)(lVar2 + 0x429) = 0;
      }
      else {
        QOpenGLPaintDevice::context(*(QOpenGLPaintDevice **)(lVar2 + 0x238));
        QOpenGLContext::format();
        iVar8 = QSurfaceFormat::samples();
        *(bool *)(lVar2 + 0x429) = 1 < iVar8;
        QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_58);
      }
      bVar5 = true;
      goto LAB_001440f9;
    }
  }
  local_58 = 2;
  local_44 = 0;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_48 = 0;
  local_40 = "default";
  bVar5 = false;
  QMessageLogger::warning
            ((char *)&local_58,
             "QPainter::begin(): QOpenGLPaintDevice\'s context needs to be current");
LAB_001440f9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGL2PaintEngineEx::begin(QPaintDevice *pdev)
{
    Q_D(QOpenGL2PaintEngineEx);

    Q_ASSERT(pdev->devType() == QInternal::OpenGL);
    d->device = static_cast<QOpenGLPaintDevice*>(pdev);

    if (!d->device)
        return false;

    d->device->ensureActiveTarget();

    if (d->device->context() != QOpenGLContext::currentContext() || !d->device->context()) {
        qWarning("QPainter::begin(): QOpenGLPaintDevice's context needs to be current");
        return false;
    }

    if (d->ctx != QOpenGLContext::currentContext()
            || (d->ctx && QOpenGLContext::currentContext() && d->ctx->format() != QOpenGLContext::currentContext()->format())) {
        d->vertexBuffer.destroy();
        d->texCoordBuffer.destroy();
        d->opacityBuffer.destroy();
        d->indexBuffer.destroy();
        d->vao.destroy();
    }

    d->ctx = QOpenGLContext::currentContext();
    d->ctx->d_func()->active_engine = this;

    QOpenGLPaintDevicePrivate::get(d->device)->beginPaint();

    d->funcs.initializeOpenGLFunctions();

    // Generate a new Vertex Array Object if we don't have one already.  We can
    // only hit the VAO-based path when using a core profile context.  This is
    // because while non-core contexts can support VAOs via extensions, legacy
    // components like the QtOpenGL module do not know about VAOs. There are
    // still tests for QGL-QOpenGL paint engine interoperability, so keep the
    // status quo for now, and avoid introducing a VAO in non-core contexts.
    const bool needsVAO = d->ctx->format().profile() == QSurfaceFormat::CoreProfile
        && d->ctx->format().version() >= std::pair(3, 2);
    if (needsVAO && !d->vao.isCreated()) {
        bool created = d->vao.create();

        // If we managed to create it then we have a profile that supports VAOs
        if (created)
            d->vao.bind();
    }

    // Generate a new Vertex Buffer Object if we don't have one already
    if (!d->vertexBuffer.isCreated()) {
        d->vertexBuffer.create();
        // Set its usage to StreamDraw, we will use this buffer only a few times before refilling it
        d->vertexBuffer.setUsagePattern(QOpenGLBuffer::StreamDraw);
    }
    if (!d->texCoordBuffer.isCreated()) {
        d->texCoordBuffer.create();
        d->texCoordBuffer.setUsagePattern(QOpenGLBuffer::StreamDraw);
    }
    if (!d->opacityBuffer.isCreated()) {
        d->opacityBuffer.create();
        d->opacityBuffer.setUsagePattern(QOpenGLBuffer::StreamDraw);
    }
    if (!d->indexBuffer.isCreated()) {
        d->indexBuffer.create();
        d->indexBuffer.setUsagePattern(QOpenGLBuffer::StreamDraw);
    }

    for (int i = 0; i < QT_GL_VERTEX_ARRAY_TRACKED_COUNT; ++i)
        d->vertexAttributeArraysEnabledState[i] = false;

    const QSize sz = d->device->size();
    d->width = sz.width();
    d->height = sz.height();
    d->mode = BrushDrawingMode;
    d->brushTextureDirty = true;
    d->brushUniformsDirty = true;
    d->matrixUniformDirty = true;
    d->matrixDirty = true;
    d->compositionModeDirty = true;
    d->opacityUniformDirty = true;
    d->needsSync = true;
    d->useSystemClip = !systemClip().isEmpty();
    d->currentBrush = QBrush();

    d->dirtyStencilRegion = QRect(0, 0, d->width, d->height);
    d->stencilClean = true;

    d->shaderManager = new QOpenGLEngineShaderManager(d->ctx);

    d->funcs.glDisable(GL_STENCIL_TEST);
    d->funcs.glDisable(GL_DEPTH_TEST);
    d->funcs.glDisable(GL_SCISSOR_TEST);

    d->glyphCacheFormat = QFontEngine::Format_A8;

#if !QT_CONFIG(opengles2)
    if (!QOpenGLContext::currentContext()->isOpenGLES()) {
        d->funcs.glDisable(GL_MULTISAMPLE);
        d->glyphCacheFormat = QFontEngine::Format_A32;
        d->multisamplingAlwaysEnabled = false;
    } else
#endif // !QT_CONFIG(opengles2)
    {
        // OpenGL ES can't switch MSAA off, so if the gl paint device is
        // multisampled, it's always multisampled.
        d->multisamplingAlwaysEnabled = d->device->context()->format().samples() > 1;
    }

    return true;
}